

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asListAnySize(ListBuilder *__return_storage_ptr__,OrphanBuilder *this)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  ushort uVar3;
  SegmentId id;
  uint uVar4;
  Kind KVar5;
  StructDataBitCount SVar6;
  CapTableBuilder *pCVar7;
  SegmentBuilder *this_00;
  word *pwVar8;
  ElementSize EVar9;
  ulong uVar10;
  OrphanBuilder *pOVar11;
  Fault f;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  
  uVar4 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value != 0 || uVar4 != 0) {
    this_00 = this->segment;
    pCVar7 = this->capTable;
    if ((uVar4 & 3) == 2) {
      this_00 = BuilderArena::getSegment((BuilderArena *)(this_00->super_SegmentReader).arena,id);
      uVar4 = (uint)(this->tag).content;
      pwVar8 = (this_00->super_SegmentReader).ptr.ptr;
      uVar10 = (ulong)(uVar4 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar8->content + uVar10);
      pOVar11 = (OrphanBuilder *)((long)&pwVar8[1].content + uVar10);
      if ((uVar4 & 4) == 0) {
        pwVar8 = &pOVar11->tag + ((int)(pOVar1->tag).content >> 2);
        pOVar11 = pOVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pwVar8 = (word *)((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                         (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pwVar8 = this->location;
      pOVar11 = this;
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    _kjCondition.left = (Kind)(pOVar11->tag).content & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.result) {
      uVar4 = *(uint *)((long)&(pOVar11->tag).content + 4);
      EVar9 = (ElementSize)uVar4 & INLINE_COMPOSITE;
      if (EVar9 == INLINE_COMPOSITE) {
        KVar5 = (Kind)pwVar8->content;
        _kjCondition.left = KVar5 & OTHER;
        _kjCondition.result = _kjCondition.left == STRUCT;
        _kjCondition.right = STRUCT;
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        if (!_kjCondition.result) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x58c,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\""
                     ,&_kjCondition,
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          kj::_::Debug::Fault::fatal(&f);
        }
        uVar2 = *(ushort *)((long)&pwVar8->content + 4);
        uVar3 = *(ushort *)((long)&pwVar8->content + 6);
        __return_storage_ptr__->segment = this_00;
        __return_storage_ptr__->capTable = pCVar7;
        __return_storage_ptr__->ptr = (byte *)(pwVar8 + 1);
        __return_storage_ptr__->elementCount = KVar5 >> 2 & 0x1fffffff;
        __return_storage_ptr__->step = ((uint)uVar3 + (uint)uVar2) * 0x40;
        __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
        __return_storage_ptr__->structPointerCount = uVar3;
        __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
      }
      else {
        SVar6 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar9 * 4);
        __return_storage_ptr__->segment = this_00;
        __return_storage_ptr__->capTable = pCVar7;
        __return_storage_ptr__->ptr = (byte *)pwVar8;
        __return_storage_ptr__->elementCount = uVar4 >> 3;
        __return_storage_ptr__->step = (uint)(EVar9 == POINTER) * 0x40 + SVar6;
        __return_storage_ptr__->structDataSize = SVar6;
        __return_storage_ptr__->structPointerCount = (ushort)(EVar9 == POINTER);
        __return_storage_ptr__->elementSize = EVar9;
      }
      goto LAB_002364da;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[92]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x582,FAILED,"ref->kind() == WirePointer::LIST",
               "_kjCondition,\"Schema mismatch: Called getWritableListPointerAnySize() but existing pointer is not a \" \"list.\""
               ,&_kjCondition,
               (char (*) [92])
               "Schema mismatch: Called getWritableListPointerAnySize() but existing pointer is not a list."
              );
    kj::_::Debug::Fault::~Fault(&f);
  }
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
  pwVar8 = (word *)0x0;
LAB_002364da:
  this->location = pwVar8;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder OrphanBuilder::asListAnySize() {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableListPointerAnySize(
      tagAsPtr(), location, segment, capTable, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = result.getLocation();

  return result;
}